

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::JsonValueWriter::writeImpl<Catch::Version,void>
          (JsonValueWriter *this,Version *value,bool quote_value)

{
  StringRef value_00;
  long *local_38;
  size_type local_30;
  long local_28 [2];
  
  operator<<((ostream *)&this->field_0x18,value);
  std::__cxx11::stringbuf::str();
  value_00.m_size = local_30;
  value_00.m_start = (char *)local_38;
  writeImpl(this,value_00,quote_value);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void writeImpl( T const& value, bool quote_value ) {
            m_sstream << value;
            writeImpl( m_sstream.str(), quote_value );
        }